

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O0

bool __thiscall RTIMUBMX055::setMagPreset(RTIMUBMX055 *this)

{
  bool bVar1;
  uchar local_1b;
  uchar local_1a;
  uchar repZ;
  uchar repXY;
  uchar mode;
  RTIMUBMX055 *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_BMX055MagPreset) {
  case 0:
    local_1a = '\x01';
    local_1b = '\x02';
    break;
  case 1:
    local_1a = '\x04';
    local_1b = '\x0e';
    break;
  case 2:
    local_1a = '\a';
    local_1b = '\x1a';
    break;
  case 3:
    local_1a = '\x17';
    local_1b = 'R';
    break;
  default:
    fprintf(_stderr,"Illegal BMX055 mag preset code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_BMX055MagPreset);
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_magSlaveAddr,
                             'L','\0',"Failed to set BMX055 mag mode");
  if (bVar1) {
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                               this->m_magSlaveAddr,'Q',local_1a,"Failed to set BMX055 mag repXY");
    if (bVar1) {
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                 this->m_magSlaveAddr,'R',local_1b,"Failed to set BMX055 mag repZ");
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUBMX055::setMagPreset()
{
    unsigned char mode, repXY, repZ;

    switch (m_settings->m_BMX055MagPreset) {
    case BMX055_MAG_LOW_POWER:                              // ODR=10, RepXY=3, RepZ=3
        mode = 0;
        repXY = 1;
        repZ = 2;
        break;

    case BMX055_MAG_REGULAR:                                // ODR=10, RepXY=9, RepZ=15
        mode = 0;
        repXY = 4;
        repZ = 14;
        break;

    case BMX055_MAG_ENHANCED:                               // ODR=10, RepXY=15, RepZ=27
        mode = 0;
        repXY = 7;
        repZ = 26;
        break;

    case BMX055_MAG_HIGH_ACCURACY:                          // ODR=10, RepXY=47, RepZ=83
        mode = 0;
        repXY = 23;
        repZ = 82;
        break;

    default:
        HAL_ERROR1("Illegal BMX055 mag preset code %d\n", m_settings->m_BMX055MagPreset);
        return false;
    }

    if (!m_settings->HALWrite(m_magSlaveAddr, BMX055_MAG_MODE, mode, "Failed to set BMX055 mag mode"))
        return false;
    if (!m_settings->HALWrite(m_magSlaveAddr, BMX055_MAG_REPXY, repXY, "Failed to set BMX055 mag repXY"))
        return false;
    if (!m_settings->HALWrite(m_magSlaveAddr, BMX055_MAG_REPZ, repZ, "Failed to set BMX055 mag repZ"))
        return false;
    return true;
}